

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O3

void rw::d3d8::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  Geometry *this;
  InstanceDataHeader *pIVar4;
  long lVar5;
  uint32 uVar6;
  uint16 *__src;
  int32 extraout_EDX;
  MeshHeader *pMVar7;
  int32 iVar8;
  long lVar9;
  uint uVar10;
  int *piVar11;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    uVar6 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar6;
    Geometry::allocateData(this);
    uVar10 = 0;
    Geometry::allocateMeshes
              (this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
    pIVar4 = this->instData;
    if (*(short *)((long)&pIVar4[1].platform + 2) != 0) {
      pMVar7 = this->meshHeader + 1;
      piVar11 = *(int **)(pIVar4 + 2);
      do {
        __src = d3d::lockIndices(*(void **)(piVar11 + 8),0,0,0);
        iVar2 = *piVar11;
        if (iVar2 == 0) {
          memcpy(*(void **)pMVar7,__src,(long)piVar11[3] * 2);
        }
        else {
          iVar3 = piVar11[3];
          if (0 < (long)iVar3) {
            lVar5 = *(long *)pMVar7;
            lVar9 = 0;
            do {
              *(uint16 *)(lVar5 + lVar9 * 2) = __src[lVar9] + (short)iVar2;
              lVar9 = lVar9 + 1;
            } while (iVar3 != lVar9);
          }
        }
        d3d::unlockIndices(*(void **)(piVar11 + 8));
        (**(code **)&rwpipe[1].super_Pipeline.platform)(this);
        pMVar7 = (MeshHeader *)&pMVar7[1].totalIndices;
        piVar11 = piVar11 + 0xe;
        uVar10 = uVar10 + 1;
      } while (uVar10 < *(ushort *)((long)&pIVar4[1].platform + 2));
    }
    iVar8 = 0;
    Geometry::generateTriangles(this,(int8 *)0x0);
    pbVar1 = (byte *)((long)&this->flags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    destroyNativeData(this,iVar8,extraout_EDX);
    return;
  }
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_D3D8);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	InstanceData *inst = header->inst;
	Mesh *mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		if(inst->minVert == 0)
			memcpy(mesh->indices, indices, inst->numIndices*2);
		else
			for(int32 j = 0; j < inst->numIndices; j++)
				mesh->indices[j] = indices[j] + inst->minVert;
		unlockIndices(inst->indexBuffer);

		pipe->uninstanceCB(geo, inst);
		mesh++;
		inst++;
	}
	geo->generateTriangles();
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}